

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBHub.cpp
# Opt level: O0

string * readToken_abi_cxx11_(char **pStart,char *pEnd,char sep)

{
  char *pcVar1;
  ulong uVar2;
  char in_CL;
  ulong in_RDX;
  ulong *in_RSI;
  string *in_RDI;
  bool bVar3;
  char *pBegin;
  allocator local_29;
  char *local_28;
  
  if (in_RDX < *in_RSI) {
    std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    pcVar1 = (char *)*in_RSI;
    while( true ) {
      bVar3 = false;
      if (*in_RSI != in_RDX) {
        bVar3 = *(char *)*in_RSI != in_CL;
      }
      if (!bVar3) break;
      *in_RSI = *in_RSI + 1;
    }
    *in_RSI = *in_RSI + 1;
    uVar2 = *in_RSI;
    local_28 = pcVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar1,~(ulong)pcVar1 + uVar2,&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  return in_RDI;
}

Assistant:

std::string readToken (const char* &pStart, const char* pEnd, char sep = ',')
{
    // Safety check
    if (pStart > pEnd) return std::string();
    
    const char* pBegin = pStart;
    for (; pStart != pEnd && *pStart != sep; ++pStart);
    // eat separator
    ++pStart;
    return std::string(pBegin, size_t(pStart - pBegin -1));
}